

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O3

void absl::lts_20240722::container_internal::ClearBackingArray
               (CommonFields *c,PolicyFunctions *policy,bool reuse,bool soo_enabled)

{
  ulong uVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  undefined7 in_register_00000011;
  size_t capacity;
  
  uVar2 = (ulong)((uint)c->size_ & 1);
  c->size_ = uVar2;
  if ((int)CONCAT71(in_register_00000011,reuse) == 0) {
    if (uVar2 != 0) {
      CommonFields::backing_array_start(c);
      if ((c->size_ & 1) != 0) {
        CommonFields::backing_array_start(c);
      }
    }
    (*policy->dealloc)(c,policy);
    c->capacity_ = (ulong)soo_enabled;
    c->size_ = 0;
    (c->heap_or_soo_).heap.control = (ctrl_t *)0x104e10;
  }
  else {
    uVar2 = c->capacity_;
    if (soo_enabled && uVar2 < 2) {
      __assert_fail("!soo_enabled || c.capacity() > SooCapacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                    ,0x14b,
                    "void absl::container_internal::ClearBackingArray(CommonFields &, const PolicyFunctions &, bool, bool)"
                   );
    }
    pcVar3 = (c->heap_or_soo_).heap.control;
    memset(pcVar3,0x80,uVar2 + 0x10);
    pcVar3[uVar2] = kSentinel;
    pcVar3 = (c->heap_or_soo_).heap.control + -8;
    if (((ulong)pcVar3 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(gl_ptr) % alignof(GrowthInfo) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x56f,"GrowthInfo &absl::container_internal::CommonFields::growth_info()");
    }
    uVar2 = c->capacity_;
    if ((uVar2 == 0) || ((uVar2 + 1 & uVar2) != 0)) {
      __assert_fail("IsValidCapacity(capacity)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x5ea,"size_t absl::container_internal::CapacityToGrowth(size_t)");
    }
    uVar1 = c->size_;
    *(ulong *)pcVar3 = uVar2 - ((uVar1 >> 1) + (uVar2 >> 3));
    if ((uVar1 & 1) != 0) {
      CommonFields::backing_array_start(c);
      return;
    }
  }
  return;
}

Assistant:

void ClearBackingArray(CommonFields& c, const PolicyFunctions& policy,
                       bool reuse, bool soo_enabled) {
  c.set_size(0);
  if (reuse) {
    assert(!soo_enabled || c.capacity() > SooCapacity());
    ResetCtrl(c, policy.slot_size);
    ResetGrowthLeft(c);
    c.infoz().RecordStorageChanged(0, c.capacity());
  } else {
    // We need to record infoz before calling dealloc, which will unregister
    // infoz.
    c.infoz().RecordClearedReservation();
    c.infoz().RecordStorageChanged(0, soo_enabled ? SooCapacity() : 0);
    (*policy.dealloc)(c, policy);
    c = soo_enabled ? CommonFields{soo_tag_t{}} : CommonFields{};
  }
}